

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvahammer.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int cnum;
  uint32_t b;
  uint32_t a;
  int local_3c;
  undefined4 local_38;
  uint local_34;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_3c = 0;
    do {
      while( true ) {
        iVar1 = getopt(argc,argv,"c:");
        if (iVar1 != 99) break;
        __isoc99_sscanf(_optarg,"%d",&local_3c);
      }
    } while (iVar1 != -1);
    if (local_3c < nva_cardsnum) {
      if (_optind < argc) {
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[_optind],"%x",&local_34);
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_38);
          do {
            *(undefined4 *)((long)nva_cards[local_3c].bar0 + (ulong)local_34) = local_38;
          } while( true );
        }
        main_cold_5();
      }
      else {
        main_cold_4();
      }
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	uint32_t a, b;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	sscanf (argv[optind + 1], "%x", &b);
	while (1)
		nva_wr32(cnum, a, b);
	return 0;
}